

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::udf_covar_state_t,int,int,duckdb::UDFCovarPopOperation>
               (int *adata,AggregateInputData *aggr_input_data,int *bdata,udf_covar_state_t **states
               ,idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *ssel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  int iVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  udf_covar_state_t *puVar7;
  ulong uVar8;
  idx_t iVar9;
  ulong uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  idx_t iVar14;
  uint64_t uVar15;
  idx_t iVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  puVar3 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0 && puVar3 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = *(long *)asel;
      lVar5 = *(long *)bsel;
      lVar6 = *(long *)ssel;
      uVar10 = 0;
      do {
        uVar11 = uVar10;
        if (lVar4 != 0) {
          uVar11 = (ulong)*(uint *)(lVar4 + uVar10 * 4);
        }
        uVar13 = uVar10;
        if (lVar5 != 0) {
          uVar13 = (ulong)*(uint *)(lVar5 + uVar10 * 4);
        }
        uVar8 = uVar10;
        if (lVar6 != 0) {
          uVar8 = (ulong)*(uint *)(lVar6 + uVar10 * 4);
        }
        puVar7 = states[uVar8];
        uVar15 = puVar7->count + 1;
        puVar7->count = uVar15;
        auVar18._8_4_ = (int)(uVar15 >> 0x20);
        auVar18._0_8_ = uVar15;
        auVar18._12_4_ = 0x45300000;
        iVar1 = bdata[uVar13];
        dVar17 = (double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0;
        dVar21 = auVar18._8_8_ - 1.9342813113834067e+25;
        dVar22 = (double)adata[uVar11] - puVar7->meanx;
        auVar19._0_8_ = dVar21 + dVar17;
        auVar19._8_8_ = dVar21 + dVar17;
        auVar23._8_8_ = (double)iVar1 - puVar7->meany;
        auVar23._0_8_ = dVar22;
        auVar24 = divpd(auVar23,auVar19);
        dVar17 = auVar24._8_8_ + puVar7->meany;
        puVar7->meanx = auVar24._0_8_ + puVar7->meanx;
        puVar7->meany = dVar17;
        puVar7->co_moment = ((double)iVar1 - dVar17) * dVar22 + puVar7->co_moment;
        uVar10 = uVar10 + 1;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    lVar4 = *(long *)asel;
    lVar5 = *(long *)bsel;
    lVar6 = *(long *)ssel;
    iVar9 = 0;
    do {
      iVar14 = iVar9;
      if (lVar4 != 0) {
        iVar14 = (idx_t)*(uint *)(lVar4 + iVar9 * 4);
      }
      iVar16 = iVar9;
      if (lVar5 != 0) {
        iVar16 = (idx_t)*(uint *)(lVar5 + iVar9 * 4);
      }
      iVar12 = iVar9;
      if (lVar6 != 0) {
        iVar12 = (idx_t)*(uint *)(lVar6 + iVar9 * 4);
      }
      if (((puVar2 == (unsigned_long *)0x0) || ((puVar2[iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0))
         && ((puVar3 == (unsigned_long *)0x0 || ((puVar3[iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0))
            )) {
        puVar7 = states[iVar12];
        uVar15 = puVar7->count + 1;
        puVar7->count = uVar15;
        auVar24._8_4_ = (int)(uVar15 >> 0x20);
        auVar24._0_8_ = uVar15;
        auVar24._12_4_ = 0x45300000;
        dVar17 = (double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0;
        dVar21 = auVar24._8_8_ - 1.9342813113834067e+25;
        iVar1 = bdata[iVar16];
        dVar22 = (double)adata[iVar14] - puVar7->meanx;
        auVar20._0_8_ = dVar21 + dVar17;
        auVar20._8_8_ = dVar21 + dVar17;
        auVar25._8_8_ = (double)iVar1 - puVar7->meany;
        auVar25._0_8_ = dVar22;
        auVar24 = divpd(auVar25,auVar20);
        dVar17 = auVar24._8_8_ + puVar7->meany;
        puVar7->meanx = auVar24._0_8_ + puVar7->meanx;
        puVar7->meany = dVar17;
        puVar7->co_moment = ((double)iVar1 - dVar17) * dVar22 + puVar7->co_moment;
      }
      iVar9 = iVar9 + 1;
    } while (count != iVar9);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}